

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseEqn.c
# Opt level: O0

Hop_Obj_t * Parse_ParserPerformTopOp(Hop_Man_t *pMan,Parse_StackFn_t *pStackFn,int Oper)

{
  Hop_Obj_t *p1;
  Hop_Obj_t *p0;
  Hop_Obj_t *local_40;
  Hop_Obj_t *gFunc;
  Hop_Obj_t *gArg2;
  Hop_Obj_t *gArg1;
  int Oper_local;
  Parse_StackFn_t *pStackFn_local;
  Hop_Man_t *pMan_local;
  
  p1 = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
  p0 = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
  if (Oper == 9) {
    local_40 = Hop_And(pMan,p0,p1);
  }
  else {
    if (Oper != 7) {
      return (Hop_Obj_t *)0x0;
    }
    local_40 = Hop_Or(pMan,p0,p1);
  }
  Parse_StackFnPush(pStackFn,local_40);
  return local_40;
}

Assistant:

Hop_Obj_t * Parse_ParserPerformTopOp( Hop_Man_t * pMan, Parse_StackFn_t * pStackFn, int Oper )
{
    Hop_Obj_t * gArg1, * gArg2, * gFunc;
    // perform the given operation
    gArg2 = (Hop_Obj_t *)Parse_StackFnPop( pStackFn );
    gArg1 = (Hop_Obj_t *)Parse_StackFnPop( pStackFn );
	if ( Oper == PARSE_EQN_OPER_AND )
		gFunc = Hop_And( pMan, gArg1, gArg2 );
	else if ( Oper == PARSE_EQN_OPER_OR )
		gFunc = Hop_Or( pMan, gArg1, gArg2 );
	else
		return NULL;
//    Cudd_Ref( gFunc );
//    Cudd_RecursiveDeref( dd, gArg1 );
//    Cudd_RecursiveDeref( dd, gArg2 );
	Parse_StackFnPush( pStackFn,  gFunc );
    return gFunc;
}